

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.hpp
# Opt level: O1

void __thiscall
jsoncons::basic_json_reader<char,jsoncons::string_source<char>,std::allocator<char>>::
basic_json_reader<std::__cxx11::string&>
          (basic_json_reader<char,jsoncons::string_source<char>,std::allocator<char>> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *source,
          basic_json_visitor<char> *visitor,basic_json_decode_options<char> *options,
          function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *err_handler,
          allocator<char> *temp_alloc)

{
  pointer pcVar1;
  _Any_data local_40;
  code *local_30;
  
  pcVar1 = (source->_M_dataplus)._M_p;
  *(pointer *)this = pcVar1;
  *(pointer *)(this + 8) = pcVar1;
  *(pointer *)(this + 0x10) = pcVar1 + source->_M_string_length;
  this[0x18] = (basic_json_reader<char,jsoncons::string_source<char>,std::allocator<char>>)0x1;
  *(undefined ***)(this + 0x20) = &PTR__basic_json_visitor_00b58ac8;
  *(basic_json_visitor<char> **)(this + 0x28) = visitor;
  std::function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)>::function
            ((function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *)&local_40,
             err_handler);
  basic_json_parser<char,_std::allocator<char>_>::basic_json_parser
            ((basic_json_parser<char,_std::allocator<char>_> *)(this + 0x30),options,
             (function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *)&local_40,
             temp_alloc);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  return;
}

Assistant:

basic_json_reader(Sourceable&& source,
                          basic_json_visitor<CharT>& visitor, 
                          const basic_json_decode_options<CharT>& options,
                          std::function<bool(json_errc,const ser_context&)> err_handler, 
                          const TempAllocator& temp_alloc = TempAllocator())
           : source_(std::forward<Sourceable>(source)),
             visitor_(visitor),
             parser_(options,err_handler,temp_alloc)
        {
        }